

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

void glfwSetWindowIcon(GLFWwindow *handle,int count,GLFWimage *images)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  _GLFWlibrary *p_Var4;
  long *__ptr;
  ulong uVar5;
  long lVar6;
  long *plVar7;
  uint uVar8;
  char *format;
  _GLFWwindow *window;
  ulong uVar9;
  int iVar10;
  
  p_Var4 = &_glfw;
  if (_glfw.initialized == 0) {
    iVar10 = 0x10001;
    format = (char *)0x0;
  }
  else {
    if (-1 < count) {
      if (count != 0) {
        p_Var4 = (_GLFWlibrary *)((ulong)(uint)count << 4);
        lVar6 = 0;
        do {
          if ((*(int *)((long)&images->width + lVar6) < 1) ||
             (*(int *)((long)&images->height + lVar6) < 1)) {
            format = "Invalid image dimensions for window icon";
            goto LAB_0023b6c5;
          }
          lVar6 = lVar6 + 0x10;
        } while (p_Var4 != (_GLFWlibrary *)lVar6);
      }
      if (count == 0) {
        XDeleteProperty(_glfw.x11.display,*(undefined8 *)(handle + 0x350),_glfw.x11.NET_WM_ICON);
      }
      else {
        if (count < 1) {
          iVar10 = 0;
        }
        else {
          lVar6 = 0;
          iVar10 = 0;
          do {
            iVar10 = iVar10 + *(int *)((long)&images->height + lVar6) *
                              *(int *)((long)&images->width + lVar6) + 2;
            lVar6 = lVar6 + 0x10;
          } while ((ulong)(uint)count << 4 != lVar6);
        }
        __ptr = (long *)calloc((long)iVar10,8);
        if (0 < count) {
          uVar5 = 0;
          plVar7 = __ptr;
          do {
            iVar1 = images[uVar5].width;
            *plVar7 = (long)iVar1;
            iVar2 = images[uVar5].height;
            plVar7[1] = (long)iVar2;
            plVar7 = plVar7 + 2;
            uVar8 = iVar2 * iVar1;
            if (0 < (int)uVar8) {
              puVar3 = images[uVar5].pixels;
              lVar6 = 0;
              uVar9 = 0;
              do {
                plVar7[uVar9] =
                     (ulong)puVar3[uVar9 * 4 + 3] << 0x18 |
                     (ulong)puVar3[uVar9 * 4 + 2] |
                     (ulong)((uint)puVar3[uVar9 * 4 + 1] << 8 | (uint)puVar3[uVar9 * 4] << 0x10);
                uVar9 = uVar9 + 1;
                lVar6 = lVar6 + -8;
              } while (uVar8 != uVar9);
              plVar7 = (long *)((long)plVar7 - lVar6);
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 != (uint)count);
        }
        XChangeProperty(_glfw.x11.display,*(undefined8 *)(handle + 0x350),_glfw.x11.NET_WM_ICON,6,
                        0x20,0,__ptr,iVar10,p_Var4);
        free(__ptr);
      }
      XFlush(_glfw.x11.display);
      return;
    }
    format = "Invalid image count for window icon";
LAB_0023b6c5:
    iVar10 = 0x10004;
  }
  _glfwInputError(iVar10,format);
  return;
}

Assistant:

GLFWAPI void glfwSetWindowIcon(GLFWwindow* handle,
                               int count, const GLFWimage* images)
{
    int i;
    _GLFWwindow* window = (_GLFWwindow*) handle;

    assert(window != NULL);
    assert(count >= 0);
    assert(count == 0 || images != NULL);

    _GLFW_REQUIRE_INIT();

    if (count < 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid image count for window icon");
        return;
    }

    for (i = 0; i < count; i++)
    {
        assert(images[i].pixels != NULL);

        if (images[i].width <= 0 || images[i].height <= 0)
        {
            _glfwInputError(GLFW_INVALID_VALUE,
                            "Invalid image dimensions for window icon");
            return;
        }
    }

    _glfwPlatformSetWindowIcon(window, count, images);
}